

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_base.c
# Opt level: O1

int zt_base_encode(zt_base_definition_t *def,void *in,size_t in_bytes,void **out,size_t *out_bytes)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  ulong lcnt;
  uchar *out_00;
  ulong uVar5;
  ulong num;
  ulong uVar6;
  int iVar7;
  
  if (out == (void **)0x0) {
    out_00 = (uchar *)0x0;
  }
  else {
    out_00 = (uchar *)*out;
  }
  if (def == (zt_base_definition_t *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = 8 < def->igroups || (uint)def->igroups * 8 != (uint)def->obits * (uint)def->ogroups;
  }
  iVar7 = -1;
  if ((out_bytes != (size_t *)0x0) && (!bVar4)) {
    if (in == (void *)0x0 || in_bytes == 0) {
      *out_bytes = 0;
      iVar7 = 0;
    }
    else {
      uVar6 = (ulong)def->igroups;
      lcnt = in_bytes / uVar6;
      uVar5 = (ulong)(uint)((int)(in_bytes % uVar6) << 3);
      num = lcnt * def->ogroups;
      if (def->obits <= uVar5) {
        if ((def->flags & zt_base_encode_with_padding) == 0) {
          num = num + uVar5 / def->obits + 1;
        }
        else {
          num = num + def->ogroups;
        }
      }
      if (out_00 == (uchar *)0x0 && out != (void **)0x0) {
        if (*out_bytes == 0) {
          out_00 = (uchar *)zt_calloc_p(num,1);
          *out = out_00;
          *out_bytes = num;
        }
        else {
          out_00 = (uchar *)0x0;
        }
      }
      uVar5 = *out_bytes;
      *out_bytes = num;
      iVar7 = -2;
      if (num <= uVar5) {
        iVar7 = 0;
        if ((out != (void **)0x0) && (out_00 != (uchar *)0x0)) {
          sVar2 = def->base;
          if (sVar2 == 0x10) {
            iVar7 = 0;
            if (uVar6 <= in_bytes) {
              pcVar3 = def->alphabet;
              iVar7 = 0;
              uVar5 = 0;
              do {
                bVar1 = *(byte *)((long)in + uVar5);
                out_00[uVar5 * 2] = pcVar3[bVar1 >> 4];
                out_00[uVar5 * 2 + 1] = pcVar3[bVar1 & 0xf];
                uVar5 = uVar5 + 1;
              } while (lcnt != uVar5);
            }
          }
          else if (sVar2 == 0x20) {
            _encode32(def,(uchar *)in,lcnt,in_bytes % (ulong)def->igroups,out_00);
            iVar7 = 0;
          }
          else {
            iVar7 = -1;
            if (sVar2 == 0x40) {
              _encode64(def,(uchar *)in,lcnt,in_bytes % (ulong)def->igroups,out_00);
              iVar7 = 0;
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int
zt_base_encode(zt_base_definition_t * def, const void * in, size_t in_bytes, void **out, size_t *out_bytes) {
    size_t                ocount;
    size_t                lcount;
    size_t                mod;
    size_t                olen;
    const unsigned char * inp = in;
    unsigned char       * outp = out ? *(unsigned char **)out : NULL;

    if (! _valid_dictionary_p(def)) {
        return -1;
    }

    /* if we are missing out_bytes then we cannot continue */
    if (!out_bytes) {
        return -1;
    }

    /* if there is no input then we cannot continue */
    if(!in || !in_bytes) {
        *out_bytes = 0;
        return 0;
    }

    /* calculate the number of (N * 8-bit) input groups and remainder */
    lcount = in_bytes / def->igroups;                        /* number of whole input groups */
    mod = ((8 * (in_bytes % def->igroups)) / def->obits);    /* portion of partial output groups */
    ocount = (lcount * def->ogroups);                        /* number of whole output groups */

    if (mod > 0) {
        if ZT_BIT_ISSET(def->flags, zt_base_encode_with_padding) {
            ocount += def->ogroups;
        } else {
            ocount += mod + 1;
        }
    }